

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopDescriptor::RemoveLoop(LoopDescriptor *this,Loop *loop)

{
  uint32_t block_id;
  bool bVar1;
  Loop *pLVar2;
  ChildrenList *this_00;
  iterator __first;
  iterator __last;
  BasicBlockListTy *this_01;
  reference pvVar3;
  Loop *local_f8;
  const_iterator local_e0;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  local_d8;
  Loop **local_d0;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  local_c8;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  local_c0;
  iterator it;
  Loop *l;
  _Node_iterator_base<unsigned_int,_false> _Stack_a8;
  uint32_t bb_id;
  const_iterator __end2;
  const_iterator __begin2;
  BasicBlockListTy *__range2;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  local_78;
  const_iterator local_70;
  Loop *local_68;
  Loop *local_60;
  Loop **local_58;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  local_50;
  Loop **local_48;
  Loop **local_40;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  local_38;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  local_30;
  const_iterator local_28;
  Loop *local_20;
  Loop *parent;
  Loop *loop_local;
  LoopDescriptor *this_local;
  
  parent = loop;
  loop_local = (Loop *)this;
  pLVar2 = Loop::GetParent(loop);
  if (pLVar2 == (Loop *)0x0) {
    local_f8 = &this->placeholder_top_loop_;
  }
  else {
    local_f8 = Loop::GetParent(parent);
  }
  local_20 = local_f8;
  local_38._M_current =
       (Loop **)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                          (&local_f8->nested_loops_);
  local_40 = (Loop **)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::
                      end(&local_20->nested_loops_);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,spvtools::opt::Loop*>
                       (local_38,(__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                                  )local_40,&parent);
  __gnu_cxx::
  __normal_iterator<spvtools::opt::Loop*const*,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>
  ::__normal_iterator<spvtools::opt::Loop**>
            ((__normal_iterator<spvtools::opt::Loop*const*,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>
              *)&local_28,&local_30);
  local_48 = (Loop **)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::
                      erase(&local_f8->nested_loops_,local_28);
  local_50._M_current =
       (Loop **)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                          (&parent->nested_loops_);
  local_58 = (Loop **)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::
                      end(&parent->nested_loops_);
  local_60 = parent;
  local_68 = (Loop *)std::
                     for_each<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,spvtools::opt::LoopDescriptor::RemoveLoop(spvtools::opt::Loop*)::__0>
                               (local_50,(__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                                          )local_58,(anon_class_8_1_898e73a2)parent);
  this_00 = &local_20->nested_loops_;
  local_78._M_current =
       (Loop **)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::end
                          (&local_20->nested_loops_);
  __gnu_cxx::
  __normal_iterator<spvtools::opt::Loop*const*,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>
  ::__normal_iterator<spvtools::opt::Loop**>
            ((__normal_iterator<spvtools::opt::Loop*const*,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>
              *)&local_70,&local_78);
  __first = std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                      (&parent->nested_loops_);
  __last = std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::end
                     (&parent->nested_loops_);
  std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
  insert<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,void>
            ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)this_00,local_70,
             (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              )__first._M_current,
             (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              )__last._M_current);
  this_01 = Loop::GetBlocks(parent);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(this_01);
  _Stack_a8._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this_01);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffff58);
    if (!bVar1) break;
    pvVar3 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    block_id = *pvVar3;
    it._M_current = (Loop **)FindLoopForBasicBlock(this,block_id);
    if ((Loop *)it._M_current == parent) {
      pLVar2 = Loop::GetParent((Loop *)it._M_current);
      SetBasicBlockToLoop(this,block_id,pLVar2);
    }
    else {
      ForgetBasicBlock(this,block_id);
    }
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  local_c8._M_current =
       (Loop **)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                          (&this->loops_);
  local_d0 = (Loop **)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::
                      end(&this->loops_);
  local_c0 = std::
             find<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,spvtools::opt::Loop*>
                       (local_c8,(__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                                  )local_d0,&parent);
  local_d8._M_current =
       (Loop **)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::end
                          (&this->loops_);
  bVar1 = __gnu_cxx::operator!=(&local_c0,&local_d8);
  pLVar2 = parent;
  if (!bVar1) {
    __assert_fail("it != loops_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x3fa,"void spvtools::opt::LoopDescriptor::RemoveLoop(Loop *)");
  }
  if (parent != (Loop *)0x0) {
    Loop::~Loop(parent);
    operator_delete(pLVar2,0x90);
  }
  __gnu_cxx::
  __normal_iterator<spvtools::opt::Loop*const*,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>
  ::__normal_iterator<spvtools::opt::Loop**>
            ((__normal_iterator<spvtools::opt::Loop*const*,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>
              *)&local_e0,&local_c0);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::erase
            (&this->loops_,local_e0);
  return;
}

Assistant:

void LoopDescriptor::RemoveLoop(Loop* loop) {
  Loop* parent = loop->GetParent() ? loop->GetParent() : &placeholder_top_loop_;
  parent->nested_loops_.erase(std::find(parent->nested_loops_.begin(),
                                        parent->nested_loops_.end(), loop));
  std::for_each(
      loop->nested_loops_.begin(), loop->nested_loops_.end(),
      [loop](Loop* sub_loop) { sub_loop->SetParent(loop->GetParent()); });
  parent->nested_loops_.insert(parent->nested_loops_.end(),
                               loop->nested_loops_.begin(),
                               loop->nested_loops_.end());
  for (uint32_t bb_id : loop->GetBlocks()) {
    Loop* l = FindLoopForBasicBlock(bb_id);
    if (l == loop) {
      SetBasicBlockToLoop(bb_id, l->GetParent());
    } else {
      ForgetBasicBlock(bb_id);
    }
  }

  LoopContainerType::iterator it =
      std::find(loops_.begin(), loops_.end(), loop);
  assert(it != loops_.end());
  delete loop;
  loops_.erase(it);
}